

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::PathArcToFast
          (ImDrawList *this,ImVec2 *centre,float radius,int a_min_of_12,int a_max_of_12)

{
  int iVar1;
  int a;
  int i;
  long lVar2;
  ImVector<ImVec2> *this_00;
  float fVar3;
  float fVar4;
  value_type local_38;
  
  if (PathArcToFast(ImVec2_const&,float,int,int)::circle_vtx == '\0') {
    iVar1 = __cxa_guard_acquire(&PathArcToFast(ImVec2_const&,float,int,int)::circle_vtx);
    if (iVar1 != 0) {
      PathArcToFast::circle_vtx[10].x = 0.0;
      PathArcToFast::circle_vtx[10].y = 0.0;
      PathArcToFast::circle_vtx[0xb].x = 0.0;
      PathArcToFast::circle_vtx[0xb].y = 0.0;
      PathArcToFast::circle_vtx[8].x = 0.0;
      PathArcToFast::circle_vtx[8].y = 0.0;
      PathArcToFast::circle_vtx[9].x = 0.0;
      PathArcToFast::circle_vtx[9].y = 0.0;
      PathArcToFast::circle_vtx[6].x = 0.0;
      PathArcToFast::circle_vtx[6].y = 0.0;
      PathArcToFast::circle_vtx[7].x = 0.0;
      PathArcToFast::circle_vtx[7].y = 0.0;
      PathArcToFast::circle_vtx[4].x = 0.0;
      PathArcToFast::circle_vtx[4].y = 0.0;
      PathArcToFast::circle_vtx[5].x = 0.0;
      PathArcToFast::circle_vtx[5].y = 0.0;
      PathArcToFast::circle_vtx[2].x = 0.0;
      PathArcToFast::circle_vtx[2].y = 0.0;
      PathArcToFast::circle_vtx[3].x = 0.0;
      PathArcToFast::circle_vtx[3].y = 0.0;
      PathArcToFast::circle_vtx[0].x = 0.0;
      PathArcToFast::circle_vtx[0].y = 0.0;
      PathArcToFast::circle_vtx[1].x = 0.0;
      PathArcToFast::circle_vtx[1].y = 0.0;
      __cxa_guard_release(&PathArcToFast(ImVec2_const&,float,int,int)::circle_vtx);
    }
  }
  if (PathArcToFast(ImVec2_const&,float,int,int)::circle_vtx_builds == '\0') {
    for (lVar2 = 0; lVar2 != 0xc; lVar2 = lVar2 + 1) {
      fVar3 = (float)(int)lVar2 / 12.0;
      fVar3 = (fVar3 + fVar3) * 3.1415927;
      fVar4 = cosf(fVar3);
      PathArcToFast::circle_vtx[lVar2].x = fVar4;
      fVar3 = sinf(fVar3);
      PathArcToFast::circle_vtx[lVar2].y = fVar3;
    }
    PathArcToFast(ImVec2_const&,float,int,int)::circle_vtx_builds = '\x01';
  }
  this_00 = &this->_Path;
  if (radius == 0.0 || a_max_of_12 < a_min_of_12) {
    ImVector<ImVec2>::push_back(this_00,centre);
    return;
  }
  ImVector<ImVec2>::reserve(this_00,(a_max_of_12 - a_min_of_12) + this_00->Size + 1);
  for (; a_min_of_12 <= a_max_of_12; a_min_of_12 = a_min_of_12 + 1) {
    local_38.x = PathArcToFast::circle_vtx[a_min_of_12 % 0xc].x * radius + (*centre).x;
    local_38.y = PathArcToFast::circle_vtx[a_min_of_12 % 0xc].y * radius + (*centre).y;
    ImVector<ImVec2>::push_back(this_00,&local_38);
  }
  return;
}

Assistant:

void ImDrawList::PathArcToFast(const ImVec2& centre, float radius, int a_min_of_12, int a_max_of_12)
{
    static ImVec2 circle_vtx[12];
    static bool circle_vtx_builds = false;
    const int circle_vtx_count = IM_ARRAYSIZE(circle_vtx);
    if (!circle_vtx_builds)
    {
        for (int i = 0; i < circle_vtx_count; i++)
        {
            const float a = ((float)i / (float)circle_vtx_count) * 2*IM_PI;
            circle_vtx[i].x = cosf(a);
            circle_vtx[i].y = sinf(a);
        }
        circle_vtx_builds = true;
    }

    if (radius == 0.0f || a_min_of_12 > a_max_of_12)
    {
        _Path.push_back(centre);
        return;
    }
    _Path.reserve(_Path.Size + (a_max_of_12 - a_min_of_12 + 1));
    for (int a = a_min_of_12; a <= a_max_of_12; a++)
    {
        const ImVec2& c = circle_vtx[a % circle_vtx_count];
        _Path.push_back(ImVec2(centre.x + c.x * radius, centre.y + c.y * radius));
    }
}